

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_neg_vec_sparc(TCGContext_conflict7 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a)

{
  TCGv_vec a_00;
  uintptr_t o;
  
  a_00 = tcg_const_zeros_vec_matching_sparc(tcg_ctx,r);
  tcg_gen_sub_vec_sparc(tcg_ctx,vece,r,a_00,a);
  tcg_temp_free_internal_sparc(tcg_ctx,(TCGTemp *)(a_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_neg_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a)
{
    const TCGOpcode *hold_list;

    tcg_assert_listed_vecop(INDEX_op_neg_vec);
    hold_list = tcg_swap_vecop_list(NULL);

    if (!TCG_TARGET_HAS_neg_vec || !do_op2(tcg_ctx, vece, r, a, INDEX_op_neg_vec)) {
        TCGv_vec t = tcg_const_zeros_vec_matching(tcg_ctx, r);
        tcg_gen_sub_vec(tcg_ctx, vece, r, t, a);
        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}